

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

void __thiscall soul::Optimisations::Inliner::perform(Inliner *this)

{
  undefined **ppuVar1;
  void **this_00;
  _func_int **pp_Var2;
  Primitive PVar3;
  Module *pMVar4;
  size_t blockIndex;
  Iterator lastStatementOfFirstBlock;
  Block *pBVar5;
  Allocator *pAVar6;
  pointer pcVar7;
  Expression *args_1;
  Statement *pSVar8;
  string *psVar9;
  pointer ppVar10;
  pointer ppVar11;
  long lVar12;
  bool bVar13;
  char cVar14;
  long *plVar15;
  Block *pBVar16;
  Variable *pVVar17;
  AssignFromValue *pAVar18;
  Variable *dest;
  mapped_type *pmVar19;
  Function *pFVar20;
  undefined8 *puVar21;
  Identifier nm;
  PoolItem *pPVar22;
  mapped_type *pmVar23;
  pointer ppVar24;
  size_type *psVar25;
  ulong uVar26;
  Variable **ppVVar27;
  Inliner *this_01;
  char cVar28;
  undefined8 uVar29;
  _func_int **pp_Var30;
  ulong uVar31;
  string_view newString;
  string_view newString_00;
  BlockBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> newParamName;
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  Variable *local_110;
  Variable *local_108;
  undefined1 local_100 [24];
  string local_e8;
  _Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_c8;
  undefined1 local_c0 [16];
  StructurePtr local_b0;
  undefined1 local_a8 [16];
  StructurePtr local_98;
  string local_90;
  string local_70;
  Block *local_50;
  _Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  pointer local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pMVar4 = this->module;
  pFVar20 = this->parentFunction;
  blockIndex = this->blockIndex;
  lastStatementOfFirstBlock.object = (Statement *)this->call;
  local_38 = &this->inlinedFnName;
  local_100._16_8_ = this;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,"@",
                 local_38);
  plVar15 = (long *)std::__cxx11::string::append((char *)local_130);
  this_01 = (Inliner *)local_100._16_8_;
  local_150._0_8_ = local_150 + 0x10;
  psVar25 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar25) {
    local_150._16_8_ = *psVar25;
    local_150._24_8_ = plVar15[3];
  }
  else {
    local_150._16_8_ = *psVar25;
    local_150._0_8_ = (size_type *)*plVar15;
  }
  local_150._8_8_ = plVar15[1];
  *plVar15 = (long)psVar25;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  pBVar16 = heart::Utilities::splitBlock
                      (pMVar4,pFVar20,blockIndex,lastStatementOfFirstBlock,(string *)local_150);
  if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  if ((string *)local_130._0_8_ != (string *)(local_130 + 0x10)) {
    operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
  }
  ((pool_ptr<soul::heart::Block> *)((long)this_01 + 0xd0))->object = pBVar16;
  local_150._0_8_ = *(FunctionCall **)((long)this_01 + 0x10);
  pBVar5 = ((*(Function **)((long)this_01 + 8))->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_start[*(size_t *)((long)this_01 + 0x18)].object;
  LinkedList<soul::heart::Statement>::
  removeMatches<soul::LinkedList<soul::heart::Statement>::remove(soul::heart::Statement&)::_lambda(soul::heart::Statement&)_1_>
            (&pBVar5->statements,(anon_class_8_1_898d2811 *)local_150);
  pFVar20 = *(Function **)((long)this_01 + 0x20);
  PVar3 = (pFVar20->returnType).primitiveType.type;
  if (PVar3 != void_) {
    pMVar4 = this_01->module;
    local_a8[0] = (pFVar20->returnType).category;
    local_a8[1] = (pFVar20->returnType).arrayElementCategory;
    local_a8[2] = (pFVar20->returnType).isRef;
    local_a8[3] = (pFVar20->returnType).isConstant;
    local_a8._8_8_ = *(undefined8 *)&(pFVar20->returnType).boundingSize;
    local_98.object = (pFVar20->returnType).structure.object;
    if (local_98.object != (Structure *)0x0) {
      ((local_98.object)->super_RefCountedObject).refCount =
           ((local_98.object)->super_RefCountedObject).refCount + 1;
    }
    pAVar6 = pMVar4->allocator;
    local_150._0_8_ = local_150 + 0x10;
    pcVar7 = (((string *)((long)this_01 + 0x28))->_M_dataplus)._M_p;
    local_a8._4_4_ = PVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_150,pcVar7,pcVar7 + *(size_type *)((long)this_01 + 0x30));
    std::__cxx11::string::append(local_150);
    newString._M_str = (char *)local_150._0_8_;
    newString._M_len = local_150._8_8_;
    local_130._0_8_ = Identifier::Pool::get(&pAVar6->identifiers,newString);
    pVVar17 = BlockBuilder::createVariable<soul::Identifier>
                        (pMVar4,(Type *)local_a8,(Identifier *)local_130,mutableLocal);
    ((pool_ptr<soul::heart::Variable> *)((long)this_01 + 0xd8))->object = pVVar17;
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_98.object);
    args_1 = ((*(FunctionCall **)((long)this_01 + 0x10))->super_Assignment).target.object;
    if ((args_1 == (Expression *)0x0) ||
       (((pool_ptr<soul::heart::Variable> *)((long)this_01 + 0xd8))->object == (Variable *)0x0)) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    pAVar18 = PoolAllocator::
              allocate<soul::heart::AssignFromValue,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Variable&>
                        (*(PoolAllocator **)(*(long *)this_01 + 0x128),
                         &((*(FunctionCall **)((long)this_01 + 0x10))->super_Assignment).
                          super_Statement.super_Object.location,args_1,
                         ((pool_ptr<soul::heart::Variable> *)((long)this_01 + 0xd8))->object);
    (pAVar18->super_Assignment).super_Statement.nextObject = (pBVar16->statements).firstObject;
    (pBVar16->statements).firstObject = (Statement *)pAVar18;
  }
  local_150._8_8_ = this_01->module;
  local_150._0_8_ = &PTR__BlockBuilder_00306d98;
  pSVar8 = (pBVar5->statements).firstObject;
  if (pSVar8 == (Statement *)0x0) {
    local_150._24_8_ = (Statement *)0x0;
  }
  else {
    do {
      local_150._24_8_ = pSVar8;
      pSVar8 = ((Statement *)local_150._24_8_)->nextObject;
    } while (((Statement *)local_150._24_8_)->nextObject != (Statement *)0x0);
  }
  pFVar20 = *(Function **)((long)this_01 + 0x20);
  local_150._16_8_ = pBVar5;
  local_50 = pBVar5;
  if ((pFVar20->parameters).numActive != 0) {
    local_c8 = (_Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)((long)this_01 + 0x98);
    uVar31 = 0;
    do {
      pVVar17 = (pFVar20->parameters).items[uVar31].object;
      local_110 = (Variable *)local_100;
      pcVar7 = (this_01->inlinedFnName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar7,pcVar7 + (this_01->inlinedFnName)._M_string_length);
      std::__cxx11::string::append((char *)&local_110);
      psVar9 = (pVVar17->name).name;
      if (psVar9 == (string *)0x0) {
        throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar7 = (psVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar7,pcVar7 + psVar9->_M_string_length);
      makeSafeIdentifierName(&local_e8,&local_70);
      pp_Var30 = (_func_int **)0xf;
      if (local_110 != (Variable *)local_100) {
        pp_Var30 = (_func_int **)local_100._0_8_;
      }
      pp_Var2 = (_func_int **)
                ((long)&(local_108->super_Expression).super_Object._vptr_Object +
                CONCAT44(local_e8._M_string_length._4_4_,(uint)local_e8._M_string_length));
      if (pp_Var30 < pp_Var2) {
        uVar29 = (_func_int **)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          uVar29 = local_e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar29 < pp_Var2) goto LAB_0027a2ec;
        plVar15 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_e8,0,(char *)0x0,(ulong)local_110);
      }
      else {
LAB_0027a2ec:
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_110,(ulong)local_e8._M_dataplus._M_p);
      }
      local_130._0_8_ = local_130 + 0x10;
      psVar9 = (string *)(plVar15 + 2);
      if ((string *)*plVar15 == psVar9) {
        local_130._16_8_ = (psVar9->_M_dataplus)._M_p;
        local_130._24_8_ = plVar15[3];
      }
      else {
        local_130._16_8_ = (psVar9->_M_dataplus)._M_p;
        local_130._0_8_ = (string *)*plVar15;
      }
      local_130._8_8_ = plVar15[1];
      *plVar15 = (long)psVar9;
      plVar15[1] = 0;
      *(undefined1 *)&(psVar9->_M_dataplus)._M_p = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        (ulong)(local_e8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != (Variable *)local_100) {
        operator_delete(local_110,(ulong)(local_100._0_8_ + 1));
      }
      local_c0[0] = (pVVar17->type).category;
      local_c0[1] = (pVVar17->type).arrayElementCategory;
      local_c0[2] = (pVVar17->type).isRef;
      local_c0[3] = (pVVar17->type).isConstant;
      local_c0._4_4_ = (pVVar17->type).primitiveType.type;
      local_c0._8_8_ = *(undefined8 *)&(pVVar17->type).boundingSize;
      local_b0.object = (pVVar17->type).structure.object;
      if (local_b0.object != (Structure *)0x0) {
        ((local_b0.object)->super_RefCountedObject).refCount =
             ((local_b0.object)->super_RefCountedObject).refCount + 1;
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_130._0_8_,(pointer)(local_130._0_8_ + local_130._8_8_));
      dest = BlockBuilder::createMutableLocalVariable
                       ((BlockBuilder *)local_150,(Type *)local_c0,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_b0.object);
      if (((*(FunctionCall **)(local_100._16_8_ + 0x10))->arguments).numActive <= uVar31) {
        throwInternalCompilerError("index < numActive","operator[]",0x9e);
      }
      BlockBuilder::addAssignment
                ((BlockBuilder *)local_150,&dest->super_Expression,
                 ((*(FunctionCall **)(local_100._16_8_ + 0x10))->arguments).items[uVar31].object);
      local_110 = pVVar17;
      pmVar19 = std::__detail::
                _Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_c8,(key_type *)&local_110);
      this_01 = (Inliner *)local_100._16_8_;
      pmVar19->object = dest;
      if ((string *)local_130._0_8_ != (string *)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
      }
      uVar31 = uVar31 + 1;
      pFVar20 = *(Function **)((long)this_01 + 0x20);
    } while (uVar31 < (pFVar20->parameters).numActive);
  }
  local_c8 = (_Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this_01->newBlocks;
  std::
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>::
  reserve((vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           *)local_c8,
          (long)(pFVar20->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pFVar20->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar24 = (this_01->targetFunction->blocks).
            super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this_01->targetFunction->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar24 != local_40) {
    local_48 = (_Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this_01->remappedBlocks;
    do {
      pVVar17 = (Variable *)local_100;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     "@",local_38);
      ppVar10 = (this_01->newBlocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar11 = (this_01->newBlocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar10 == ppVar11) {
        ppVVar27 = &local_108;
        local_110 = pVVar17;
      }
      else {
        uVar31 = (long)ppVar11 - (long)ppVar10 >> 3;
        cVar28 = '\x01';
        if (9 < uVar31) {
          uVar26 = uVar31;
          cVar14 = '\x04';
          do {
            cVar28 = cVar14;
            if (uVar26 < 100) {
              cVar28 = cVar28 + -2;
              goto LAB_0027a5c1;
            }
            if (uVar26 < 1000) {
              cVar28 = cVar28 + -1;
              goto LAB_0027a5c1;
            }
            if (uVar26 < 10000) goto LAB_0027a5c1;
            bVar13 = 99999 < uVar26;
            uVar26 = uVar26 / 10000;
            cVar14 = cVar28 + '\x04';
          } while (bVar13);
          cVar28 = cVar28 + '\x01';
        }
LAB_0027a5c1:
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_e8,cVar28);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_e8._M_dataplus._M_p,(uint)local_e8._M_string_length,uVar31);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x289251);
        local_110 = (Variable *)local_100;
        pVVar17 = (Variable *)(plVar15 + 2);
        if ((Variable *)*plVar15 == pVVar17) {
          local_100._0_8_ = (pVVar17->super_Expression).super_Object._vptr_Object;
          local_100._8_8_ = plVar15[3];
        }
        else {
          local_100._0_8_ = (pVVar17->super_Expression).super_Object._vptr_Object;
          local_110 = (Variable *)*plVar15;
        }
        ppVVar27 = (Variable **)(plVar15 + 1);
        local_108 = (Variable *)plVar15[1];
        *plVar15 = (long)pVVar17;
      }
      *ppVVar27 = (Variable *)0x0;
      *(undefined1 *)&(pVVar17->super_Expression).super_Object._vptr_Object = 0;
      pp_Var30 = (_func_int **)0xf;
      if ((string *)local_130._0_8_ != (string *)(local_130 + 0x10)) {
        pp_Var30 = (_func_int **)local_130._16_8_;
      }
      pp_Var2 = (_func_int **)
                ((long)&(local_108->super_Expression).super_Object._vptr_Object + local_130._8_8_);
      if (pp_Var30 < pp_Var2) {
        pp_Var30 = (_func_int **)0xf;
        if (local_110 != (Variable *)local_100) {
          pp_Var30 = (_func_int **)local_100._0_8_;
        }
        if (pp_Var30 < pp_Var2) goto LAB_0027a68f;
        puVar21 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,local_130._0_8_);
      }
      else {
LAB_0027a68f:
        puVar21 = (undefined8 *)std::__cxx11::string::_M_append(local_130,(ulong)local_110);
      }
      local_150._0_8_ = local_150 + 0x10;
      ppuVar1 = (undefined **)(puVar21 + 2);
      if ((undefined **)*puVar21 == ppuVar1) {
        local_150._16_8_ = *ppuVar1;
        local_150._24_8_ = puVar21[3];
      }
      else {
        local_150._16_8_ = *ppuVar1;
        local_150._0_8_ = (undefined **)*puVar21;
      }
      local_150._8_8_ = puVar21[1];
      *puVar21 = ppuVar1;
      puVar21[1] = 0;
      *(char *)ppuVar1 = '\0';
      if (local_110 != (Variable *)local_100) {
        operator_delete(local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((ppVar10 != ppVar11) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2)) {
        operator_delete(local_e8._M_dataplus._M_p,
                        (ulong)(local_e8.field_2._M_allocated_capacity + 1));
      }
      if ((string *)local_130._0_8_ != (string *)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
      }
      lVar12 = *(long *)local_100._16_8_;
      newString_00._M_str = (char *)local_150._0_8_;
      newString_00._M_len = local_150._8_8_;
      nm = Identifier::Pool::get((Pool *)(*(long *)(lVar12 + 0x128) + 0x20),newString_00);
      pPVar22 = PoolAllocator::allocateSpaceForObject(*(PoolAllocator **)(lVar12 + 0x128),0x78);
      this_00 = &pPVar22->item;
      heart::Block::Block((Block *)this_00,nm);
      pPVar22->destructor =
           PoolAllocator::allocate<soul::heart::Block,_soul::Identifier>::anon_class_1_0_00000001::
           __invoke;
      local_130._0_8_ = this_00;
      std::
      vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
      ::emplace_back<soul::pool_ref<soul::heart::Block>>
                ((vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
                  *)local_c8,(pool_ref<soul::heart::Block> *)local_130);
      pmVar23 = std::__detail::
                _Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_48,ppVar24);
      pmVar23->object = (Block *)this_00;
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
      }
      ppVar24 = ppVar24 + 1;
      this_01 = (Inliner *)local_100._16_8_;
    } while (ppVar24 != local_40);
  }
  std::vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<soul::pool_ref<soul::heart::Block>*,std::vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>>>
            ((vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
              *)&this_01->parentFunction->blocks,
             (this_01->parentFunction->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this_01->blockIndex + 1,
             (this_01->newBlocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this_01->newBlocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  ppVar24 = (this_01->newBlocks).
            super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar22 = PoolAllocator::allocateSpaceForObject(&this_01->module->allocator->pool,0x58);
  pBVar16 = ppVar24->object;
  *(undefined8 *)&pPVar22->field_0x18 = 0;
  pPVar22[1].size = 0;
  pPVar22->item = &PTR__Branch_00306dc0;
  pPVar22[1].destructor = (DestructorFn *)pBVar16;
  pPVar22[1].item = &pPVar22[2].destructor;
  *(undefined8 *)&pPVar22[1].field_0x18 = 0;
  pPVar22[2].size = 4;
  pPVar22->destructor =
       PoolAllocator::allocate<soul::heart::Branch,_soul::pool_ref<soul::heart::Block>_&>::
       anon_class_1_0_00000001::__invoke;
  (local_50->terminator).object = (Terminator *)&pPVar22->item;
  ppVar24 = (this_01->newBlocks).
            super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this_01->newBlocks).
      super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar24) {
    uVar31 = 0;
    do {
      cloneBlock(this_01,ppVar24[uVar31].object,
                 (this_01->targetFunction->blocks).
                 super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar31].object);
      uVar31 = uVar31 + 1;
      ppVar24 = (this_01->newBlocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar31 < (ulong)((long)(this_01->newBlocks).
                                    super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar24 >> 3)
            );
  }
  return;
}

Assistant:

void perform()
        {
            auto& postBlock = heart::Utilities::splitBlock (module, parentFunction, blockIndex, call, "@" + inlinedFnName + "_end");
            postCallResumeBlock = postBlock;
            auto& preBlock = parentFunction.blocks[blockIndex].get();

            preBlock.statements.remove (call);

            if (! targetFunction.returnType.isVoid())
            {
                returnValueVar = BlockBuilder::createVariable (module, targetFunction.returnType,
                                                               module.allocator.get (inlinedFnName + "_retval"),
                                                               heart::Variable::Role::mutableLocal);

                postBlock.statements.insertFront (module.allocate<heart::AssignFromValue> (call.location, *call.target, *returnValueVar));
            }

            {
                BlockBuilder builder (module, preBlock);

                for (size_t i = 0; i < targetFunction.parameters.size(); ++i)
                {
                    auto& param = targetFunction.parameters[i].get();
                    auto newParamName = inlinedFnName + "_param_" + makeSafeIdentifierName (param.name);
                    auto& localParamVar = builder.createMutableLocalVariable (param.type, newParamName);
                    builder.addAssignment (localParamVar, call.arguments[i]);
                    remappedVariables[param] = localParamVar;
                }
            }

            newBlocks.reserve (targetFunction.blocks.size());

            for (auto& b : targetFunction.blocks)
            {
                // NB: the name of the first block must be "@" + inlinedFnName, since that's what the unique
                // name picker will look for to make sure there's not a block name clash
                auto name = "@" + inlinedFnName + (newBlocks.empty() ? std::string() : ("_" + std::to_string (newBlocks.size())));
                auto& newBlock = module.allocate<heart::Block> (module.allocator.get (name));
                newBlocks.push_back (newBlock);
                remappedBlocks[b] = newBlock;
            }

            parentFunction.blocks.insert (getIteratorForIndex (parentFunction.blocks, blockIndex + 1),
                                          newBlocks.begin(), newBlocks.end());

            preBlock.terminator = module.allocate<heart::Branch> (newBlocks.front());

            for (size_t i = 0; i < newBlocks.size(); ++i)
                cloneBlock (newBlocks[i], targetFunction.blocks[i]);
        }